

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

Nwk_Obj_t * Nwk_ManReallocNode(Nwk_Obj_t *pObj)

{
  Nwk_Obj_t **__src;
  Nwk_Man_t *pNVar1;
  int *piVar2;
  Nwk_Obj_t **__dest;
  int iVar3;
  
  iVar3 = pObj->nFanouts + pObj->nFanins;
  if (iVar3 == pObj->nFanioAlloc) {
    __src = pObj->pFanio;
    __dest = (Nwk_Obj_t **)Aig_MmFlexEntryFetch(pObj->pMan->pMemObjs,iVar3 * 0x10);
    pObj->pFanio = __dest;
    memmove(__dest,__src,(long)pObj->nFanioAlloc << 3);
    pObj->nFanioAlloc = pObj->nFanioAlloc << 1;
    pNVar1 = pObj->pMan;
    piVar2 = &pNVar1->nRealloced;
    *piVar2 = *piVar2 + 1;
    return (Nwk_Obj_t *)pNVar1;
  }
  __assert_fail("Nwk_ObjReallocIsNeeded(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                ,0x92,"Nwk_Obj_t *Nwk_ManReallocNode(Nwk_Obj_t *)");
}

Assistant:

static Nwk_Obj_t * Nwk_ManReallocNode( Nwk_Obj_t * pObj )
{  
    Nwk_Obj_t ** pFanioOld = pObj->pFanio;
    assert( Nwk_ObjReallocIsNeeded(pObj) );
    pObj->pFanio = (Nwk_Obj_t **)Aig_MmFlexEntryFetch( pObj->pMan->pMemObjs, 2 * pObj->nFanioAlloc * sizeof(Nwk_Obj_t *) );
    memmove( pObj->pFanio, pFanioOld, pObj->nFanioAlloc * sizeof(Nwk_Obj_t *) );
    pObj->nFanioAlloc *= 2;
    pObj->pMan->nRealloced++;
    return NULL;
}